

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_free_debug_globals_locks(void)

{
  void *lock_tmp_;
  
  if (event_debug_map_lock_ != (void *)0x0) {
    if ((event_debug_map_lock_ != (void *)0x0) &&
       (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0)) {
      (*evthread_lock_fns_.free)(event_debug_map_lock_,0);
    }
    event_debug_map_lock_ = (void *)0x0;
    evthreadimpl_disable_lock_debugging_();
  }
  return;
}

Assistant:

static void
event_free_debug_globals_locks(void)
{
#ifndef EVENT__DISABLE_THREAD_SUPPORT
#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_map_lock_ != NULL) {
		EVTHREAD_FREE_LOCK(event_debug_map_lock_, 0);
		event_debug_map_lock_ = NULL;
		evthreadimpl_disable_lock_debugging_();
	}
#endif /* EVENT__DISABLE_DEBUG_MODE */
#endif /* EVENT__DISABLE_THREAD_SUPPORT */
	return;
}